

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_bind_null(sqlite3_stmt *stmt,int idx)

{
  int iVar1;
  undefined4 in_ESI;
  Value *in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  Value *this;
  undefined7 in_stack_ffffffffffffff88;
  LogicalTypeId in_stack_ffffffffffffff8f;
  LogicalType *in_stack_ffffffffffffff90;
  Value local_68;
  
  this = &local_68;
  duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8f);
  duckdb::Value::Value(this,(LogicalType *)CONCAT44(in_ESI,in_stack_ffffffffffffff78));
  iVar1 = sqlite3_internal_bind_value
                    ((sqlite3_stmt *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                     (int)((ulong)this >> 0x20),(Value *)CONCAT44(in_ESI,in_stack_ffffffffffffff78))
  ;
  duckdb::Value::~Value(in_RDI);
  duckdb::LogicalType::~LogicalType((LogicalType *)0x20c930);
  return iVar1;
}

Assistant:

int sqlite3_bind_null(sqlite3_stmt *stmt, int idx) {
	return sqlite3_internal_bind_value(stmt, idx, Value());
}